

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

int run_tests(test **tests,int test_count)

{
  uint uVar1;
  test *test;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t __size;
  size_t __n;
  long lVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong auStack_50 [2];
  size_t sStack_40;
  long local_38;
  
  sStack_40 = 0x10265f;
  uVar7 = mixed_version();
  uVar12 = 0;
  sStack_40 = 0x102673;
  printf("This is libmixed %s\n",uVar7);
  sStack_40 = 0x102684;
  printf("\x1b[1;33m --> \x1b[0;0mWill run %i tests.\n",(ulong)(uint)test_count);
  lVar5 = -((ulong)(uint)test_count * 8 + 0xf & 0xfffffffffffffff0);
  local_38 = (long)&local_38 + lVar5;
  uVar11 = (ulong)(uint)test_count;
  if (test_count < 1) {
    uVar11 = uVar12;
  }
  uVar10 = 0;
  uVar9 = 0;
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    test = tests[uVar12];
    *(undefined8 *)((long)&sStack_40 + lVar5) = 0x1026ba;
    iVar6 = run_test(test);
    if (iVar6 == 0) {
      lVar8 = (long)(int)uVar9;
      uVar9 = uVar9 + 1;
      *(test **)(local_38 + lVar8 * 8) = tests[uVar12];
    }
    else {
      uVar10 = uVar10 + 1;
    }
  }
  *(undefined8 *)((long)&sStack_40 + lVar5) = 0x1026f4;
  fprintf(_stderr,"\nPassed: %3i",(ulong)uVar10);
  *(undefined8 *)((long)&sStack_40 + lVar5) = 0x102707;
  fprintf(_stderr,"\nFailed: %3i\n",(ulong)uVar9);
  if (uVar9 != 0) {
    *(undefined8 *)((long)&sStack_40 + lVar5) = 0x2e;
    __size = *(size_t *)((long)&sStack_40 + lVar5);
    *(undefined8 *)((long)&sStack_40 + lVar5) = 1;
    __n = *(size_t *)((long)&sStack_40 + lVar5);
    *(undefined8 *)((long)&sStack_40 + lVar5) = 0x102736;
    fwrite("\x1b[1;33m --> \x1b[0;0mThe following tests failed:\n",__size,__n,_stderr);
    uVar11 = 0;
    if (0 < (int)uVar9) {
      uVar11 = (ulong)uVar9;
    }
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      puVar2 = *(undefined8 **)(local_38 + uVar12 * 8);
      uVar7 = *puVar2;
      uVar3 = puVar2[1];
      uVar4 = puVar2[2];
      uVar10 = *(uint *)(puVar2 + 3);
      uVar1 = *(uint *)((long)puVar2 + 0x1c);
      *(undefined8 **)((long)&sStack_40 + lVar5) = puVar2 + 4;
      *(ulong *)((long)auStack_50 + lVar5 + 8) = (ulong)uVar1;
      *(undefined8 *)((long)auStack_50 + lVar5) = 0x102781;
      fprintf(_stderr,"%s %s %s:%i (%i):\n  %s\n",uVar7,uVar3,uVar4,(ulong)uVar10);
    }
  }
  return (int)(uVar9 == 0);
}

Assistant:

int run_tests(struct test *tests[], int test_count){
  printf("This is libmixed %s\n", mixed_version());
  printf("\033[1;33m --> \033[0;0mWill run %i tests.\n", test_count);
  struct test *failed[test_count];
  int failures = 0;
  int passes = 0;

  for(int i=0; i<test_count; ++i){
    if(run_test(tests[i])){
      ++passes;
    }else{
      failed[failures++] = tests[i];
    }
  }
  
  fprintf(stderr, "\nPassed: %3i", passes);
  fprintf(stderr, "\nFailed: %3i\n", failures);
  if(failures){
    fprintf(stderr, "\033[1;33m --> \033[0;0mThe following tests failed:\n");
    for(int i=0; i<failures; ++i){
      struct test *test = failed[i];
      fprintf(stderr, "%s %s %s:%i (%i):\n  %s\n", test->suite, test->name, test->file, test->line, test->form, test->reason);
    }
  }
  return (failures == 0);
}